

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode Curl_bump_headersize(Curl_easy *data,size_t delta,_Bool connect_only)

{
  int iVar1;
  uint local_34;
  ulong uStack_30;
  uint max;
  size_t bad;
  _Bool connect_only_local;
  size_t delta_local;
  Curl_easy *data_local;
  
  uStack_30 = 0;
  local_34 = 0x4b000;
  if (delta < 0x4b000) {
    iVar1 = (int)delta;
    (data->info).header_size = iVar1 + (data->info).header_size;
    (data->req).allheadercount = iVar1 + (data->req).allheadercount;
    if (!connect_only) {
      (data->req).headerbytecount = iVar1 + (data->req).headerbytecount;
    }
    if ((data->req).allheadercount < 0x4b001) {
      if (0x5dc000 < (data->info).header_size) {
        uStack_30 = (ulong)(data->info).header_size;
        local_34 = 0x5dc000;
      }
    }
    else {
      uStack_30 = (ulong)(data->req).allheadercount;
    }
  }
  else {
    uStack_30 = (data->req).allheadercount + delta;
  }
  if (uStack_30 == 0) {
    data_local._4_4_ = CURLE_OK;
  }
  else {
    Curl_failf(data,"Too large response headers: %zu > %u",uStack_30,(ulong)local_34);
    data_local._4_4_ = CURLE_RECV_ERROR;
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_bump_headersize(struct Curl_easy *data,
                              size_t delta,
                              bool connect_only)
{
  size_t bad = 0;
  unsigned int max = MAX_HTTP_RESP_HEADER_SIZE;
  if(delta < MAX_HTTP_RESP_HEADER_SIZE) {
    data->info.header_size += (unsigned int)delta;
    data->req.allheadercount += (unsigned int)delta;
    if(!connect_only)
      data->req.headerbytecount += (unsigned int)delta;
    if(data->req.allheadercount > max)
      bad = data->req.allheadercount;
    else if(data->info.header_size > (max * 20)) {
      bad = data->info.header_size;
      max *= 20;
    }
  }
  else
    bad = data->req.allheadercount + delta;
  if(bad) {
    failf(data, "Too large response headers: %zu > %u", bad, max);
    return CURLE_RECV_ERROR;
  }
  return CURLE_OK;
}